

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint32_t leveldb::Hash(char *data,size_t n,uint32_t seed)

{
  long lVar1;
  uint32_t uVar2;
  long lVar3;
  uint in_EDX;
  long in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  uint32_t w;
  uint32_t h;
  char *limit;
  uint32_t r;
  uint32_t m;
  char *in_stack_ffffffffffffffc0;
  uint local_34;
  byte *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = in_EDX ^ (int)in_RSI * -0x395b586d;
  for (local_10 = in_RDI; local_10 + 4 <= in_RDI + in_RSI; local_10 = local_10 + 4) {
    uVar2 = DecodeFixed32(in_stack_ffffffffffffffc0);
    local_34 = (uVar2 + local_34) * -0x395b586d;
    local_34 = local_34 >> 0x10 ^ local_34;
  }
  lVar3 = (long)(in_RDI + in_RSI) - (long)local_10;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      if (lVar3 != 3) goto LAB_018d501a;
      local_34 = (uint)local_10[2] * 0x10000 + local_34;
    }
    local_34 = (uint)local_10[1] * 0x100 + local_34;
  }
  local_34 = (*local_10 + local_34) * -0x395b586d;
  local_34 = local_34 >> 0x18 ^ local_34;
LAB_018d501a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t Hash(const char* data, size_t n, uint32_t seed) {
  // Similar to murmur hash
  const uint32_t m = 0xc6a4a793;
  const uint32_t r = 24;
  const char* limit = data + n;
  uint32_t h = seed ^ (n * m);

  // Pick up four bytes at a time
  while (data + 4 <= limit) {
    uint32_t w = DecodeFixed32(data);
    data += 4;
    h += w;
    h *= m;
    h ^= (h >> 16);
  }

  // Pick up remaining bytes
  switch (limit - data) {
    case 3:
      h += static_cast<uint8_t>(data[2]) << 16;
      FALLTHROUGH_INTENDED;
    case 2:
      h += static_cast<uint8_t>(data[1]) << 8;
      FALLTHROUGH_INTENDED;
    case 1:
      h += static_cast<uint8_t>(data[0]);
      h *= m;
      h ^= (h >> r);
      break;
  }
  return h;
}